

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool compress_file(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,comp_options *options,
                  char *pSeed_filename,float *pTotal_comp_time)

{
  bool bVar1;
  lzham_compress_status_t lVar2;
  lzham_uint32 lVar3;
  FILE *__stream;
  FILE *__stream_00;
  ulong uVar4;
  void *__ptr;
  lzham_uint8 *__ptr_00;
  timer_ticks tVar5;
  lzham_compress_state_ptr pvVar6;
  timer_ticks tVar7;
  lzham_compress_state_ptr pvVar8;
  size_t sVar9;
  __off64_t _Var10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  char *pMsg;
  long lVar15;
  uint uVar16;
  size_t __n;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  size_t out_num_bytes;
  lzham_compress_params params;
  size_t num_in_bytes;
  size_t local_b8;
  uint local_b0;
  uint local_ac;
  lzham_compress_params local_a8;
  ulong local_68;
  timer_ticks local_60;
  ulong local_58;
  timer_ticks local_50;
  lzham_compress_state_ptr local_48;
  __off64_t local_40;
  float *local_38;
  
  if (pTotal_comp_time != (float *)0x0) {
    *pTotal_comp_time = 0.0;
  }
  local_38 = pTotal_comp_time;
  puts("Testing: Streaming compression");
  __stream = fopen64(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    pMsg = "Unable to read file: %s\n";
    pDst_filename = pSrc_filename;
LAB_001051e1:
    print_error(pMsg,pDst_filename);
    return false;
  }
  __stream_00 = fopen64(pDst_filename,"wb");
  if (__stream_00 == (FILE *)0x0) {
    pMsg = "Unable to create file: %s\n";
    goto LAB_001051e1;
  }
  lVar15 = 0;
  fseeko64(__stream,0,2);
  uVar4 = ftello64(__stream);
  fseeko64(__stream,0,0);
  fputc(0x4c,__stream_00);
  fputc(0x5a,__stream_00);
  fputc(0x48,__stream_00);
  fputc(0x30,__stream_00);
  fputc(options->m_dict_size_log2,__stream_00);
  do {
    fputc((uint)(uVar4 >> ((byte)lVar15 & 0x3f)) & 0xff,__stream_00);
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x40);
  local_40 = ftello64(__stream_00);
  __ptr = (void *)memalign(0x10,0x40000);
  __ptr_00 = (lzham_uint8 *)memalign(0x10,0x40000);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (lzham_uint8 *)0x0)) {
    print_error("Out of memory!\n");
    free(__ptr);
    free(__ptr_00);
    fclose(__stream);
    fclose(__stream_00);
    return false;
  }
  local_60 = timer::get_ticks();
  local_a8.m_pSeed_bytes = (void *)0x0;
  local_a8.m_table_max_update_interval = 0;
  local_a8.m_table_update_interval_slow_rate = 0;
  local_a8.m_num_seed_bytes = 0;
  local_a8._28_4_ = 0;
  local_a8.m_dict_size_log2 = options->m_dict_size_log2;
  local_a8.m_struct_size = 0x38;
  local_a8.m_compress_flags = 0;
  local_a8.m_max_helper_threads = options->m_max_helper_threads;
  if (options->m_extreme_parsing == true) {
    local_a8.m_compress_flags._0_1_ = 2;
    local_a8.m_compress_flags._1_3_ = 0;
  }
  if (options->m_deterministic_parsing == true) {
    local_a8._16_8_ = local_a8._16_8_ | 0x400000000;
  }
  if (options->m_tradeoff_decomp_rate_for_comp_ratio == true) {
    local_a8._16_8_ = local_a8._16_8_ | 0x1000000000;
  }
  if (options->m_force_single_threaded_parsing == true) {
    local_a8._16_8_ = local_a8._16_8_ | 0x4000000000;
  }
  if (options->m_low_memory_finder == true) {
    local_a8._16_8_ = local_a8._16_8_ | 0x8000000000;
  }
  local_a8.m_table_update_rate = options->m_table_update_rate;
  local_a8.m_level = options->m_comp_level;
  local_a8.m_fast_bytes = options->m_fast_bytes;
  local_a8.m_extreme_parsing_max_best_arrivals = options->m_max_best_arrivals;
  if ((pSeed_filename != (char *)0x0) &&
     (bVar1 = read_seed_file(pSeed_filename,&local_a8.m_num_seed_bytes,&local_a8.m_pSeed_bytes,
                             options->m_dict_size_log2), !bVar1)) {
    free(__ptr);
    free(__ptr_00);
    fclose(__stream);
    fclose(__stream_00);
    return false;
  }
  tVar5 = timer::get_ticks();
  pvVar6 = (*lzham_dll->lzham_compress_init)(&local_a8);
  tVar7 = timer::get_ticks();
  dVar17 = timer::ticks_to_secs(tVar7 - tVar5);
  if (pvVar6 != (lzham_compress_state_ptr)0x0) {
    if ((options->m_test_compressor_reinit != true) ||
       (pvVar8 = (*lzham_dll->lzham_compress_reinit)(pvVar6),
       pvVar8 != (lzham_compress_state_ptr)0x0)) goto LAB_00104cb6;
    (*lzham_dll->lzham_compress_deinit)(pvVar6);
  }
  pvVar6 = (lzham_compress_state_ptr)0x0;
LAB_00104cb6:
  if (pvVar6 == (lzham_compress_state_ptr)0x0) {
    print_error("Failed initializing compressor!\n");
    free(__ptr);
    free(__ptr_00);
    fclose(__stream);
    fclose(__stream_00);
    free(local_a8.m_pSeed_bytes);
    return false;
  }
  dVar18 = timer::ticks_to_secs(tVar7 - tVar5);
  printf("lzham_compress_init took %3.3fms\n",dVar18 * 1000.0);
  local_68 = uVar4 >> 1;
  bVar1 = true;
  fVar20 = (float)dVar17;
  local_ac = (uint)options->m_test_compressor_reinit;
  local_b0 = local_ac + 1;
  lVar2 = LZHAM_COMP_STATUS_FAILED;
  __n = 0;
  uVar16 = 0;
  uVar12 = 0;
  uVar13 = uVar4;
  do {
    do {
      if (uVar4 != 0) {
        tVar5 = timer::get_ticks();
        dVar17 = timer::ticks_to_secs(tVar5 - local_60);
        lVar15 = uVar4 - uVar13;
        auVar22._8_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar22._0_8_ = lVar15;
        auVar22._12_4_ = 0x45300000;
        iVar14 = 0xf;
        do {
          printf("\b\b\b\b");
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
        printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
               (double)((1.0 - (float)uVar13 / (float)uVar4) * 100.0),
               (double)((float)uVar13 * 9.536743e-07),
               -(uint)(0.0 < dVar17) &
               SUB84((((auVar22._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) / dVar17) *
                     9.5367431640625e-07,0));
        printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
      }
      if (uVar16 == (uint)__n) {
        __n = 0x40000;
        if (uVar13 < 0x40000) {
          __n = uVar13;
        }
        sVar9 = fread(__ptr,1,__n,__stream);
        if (sVar9 != __n) {
          putchar(10);
          print_error("Failure reading from source file!\n");
          free(__ptr);
          free(__ptr_00);
          fclose(__stream);
          fclose(__stream_00);
          free(local_a8.m_pSeed_bytes);
          (*lzham_dll->lzham_compress_deinit)(pvVar6);
          goto LAB_001052d3;
        }
        uVar13 = uVar13 - __n;
        uVar16 = 0;
      }
      local_58 = (ulong)((int)__n - uVar16);
      local_b8 = 0x40000;
      tVar5 = timer::get_ticks();
      lVar2 = (*lzham_dll->lzham_compress)
                        (pvVar6,(lzham_uint8 *)((ulong)uVar16 + (long)__ptr),&local_58,__ptr_00,
                         &local_b8,SUB14(uVar13 == 0,0));
      tVar7 = timer::get_ticks();
      dVar17 = timer::ticks_to_secs(tVar7 - tVar5);
      uVar16 = uVar16 + (int)local_58;
      if ((local_b8 == 0) ||
         (sVar9 = fwrite(__ptr_00,1,local_b8 & 0xffffffff,__stream_00), sVar9 == local_b8)) {
        iVar14 = (uint)(LZHAM_COMP_STATUS_HAS_MORE_OUTPUT < lVar2) << 3;
      }
      else {
        putchar(10);
        print_error("Failure writing to destination file!\n");
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        free(local_a8.m_pSeed_bytes);
        (*lzham_dll->lzham_compress_deinit)(pvVar6);
        iVar14 = 1;
      }
      fVar20 = fVar20 + (float)dVar17;
    } while (iVar14 == 0);
    if (iVar14 != 8) break;
    iVar14 = 0xf;
    do {
      printf("\b\b\b\b    \b\b\b\b");
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    if (((byte)local_ac & uVar12 == 0) != 0) {
      putchar(10);
      _Var10 = ftello64(__stream_00);
      printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar4,_Var10);
      local_50 = timer::get_ticks();
      local_48 = (*lzham_dll->lzham_compress_reinit)(pvVar6);
      if (local_48 == (lzham_compress_state_ptr)0x0) {
        print_error("Failed reinitializing compressor!\n");
        free(__ptr);
        free(__ptr_00);
        fclose(__stream);
        fclose(__stream_00);
        free(local_a8.m_pSeed_bytes);
        (*lzham_dll->lzham_compress_deinit)(pvVar6);
      }
      else {
        tVar5 = timer::get_ticks();
        dVar17 = timer::ticks_to_secs(tVar5 - local_50);
        printf("lzham_compress_reinit took %3.3fms\n",dVar17 * 1000.0);
        uVar16 = 0;
        fseek(__stream,0,0);
        fseek(__stream_00,local_40,0);
        __n = 0;
        uVar13 = uVar4;
      }
      if (local_48 == (lzham_compress_state_ptr)0x0) break;
    }
    uVar12 = uVar12 + 1;
    bVar1 = uVar12 < local_b0;
  } while (uVar12 != local_b0);
LAB_001052d3:
  if (bVar1) {
    return false;
  }
  tVar5 = timer::get_ticks();
  lVar3 = (*lzham_dll->lzham_compress_deinit)(pvVar6);
  tVar7 = timer::get_ticks();
  dVar17 = timer::ticks_to_secs(tVar7 - tVar5);
  fVar20 = fVar20 + (float)dVar17;
  if (local_38 != (float *)0x0) {
    *local_38 = fVar20;
  }
  tVar7 = timer::get_ticks();
  tVar5 = 1;
  if (tVar7 - local_60 != 0) {
    tVar5 = tVar7 - local_60;
  }
  dVar17 = timer::ticks_to_secs(tVar5);
  uVar11 = ftello64(__stream_00);
  free(__ptr);
  free(__ptr_00);
  free(local_a8.m_pSeed_bytes);
  local_a8.m_pSeed_bytes = (void *)0x0;
  fclose(__stream);
  fclose(__stream_00);
  if (lVar2 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    print_error("Compression failed with status %i\n",(ulong)lVar2);
    return false;
  }
  if (uVar13 + ((int)__n - uVar16) != 0) {
    print_error("Compressor failed to consume entire input file!\n");
    return false;
  }
  puts("Success");
  uVar13 = local_68;
  printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",uVar4,uVar11);
  if ((long)uVar4 < 0) {
    fVar21 = (float)(long)((uint)uVar4 & 1 | uVar13);
    fVar21 = fVar21 + fVar21;
  }
  else {
    fVar21 = (float)(long)uVar4;
  }
  printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
         ,(double)fVar20,(double)(fVar21 / fVar20),SUB84((double)((float)uVar11 / fVar20),0));
  auVar19._8_4_ = (int)(uVar4 >> 0x20);
  auVar19._0_8_ = uVar4;
  auVar19._12_4_ = 0x45300000;
  auVar23._8_4_ = (int)(uVar11 >> 0x20);
  auVar23._0_8_ = uVar11;
  auVar23._12_4_ = 0x45300000;
  printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n",
         dVar17,((auVar19._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(uint)uVar4) - 4503599627370496.0)) / dVar17,
         SUB84(((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) / dVar17,0));
  printf("Input file adler32: 0x%08X\n",lVar3);
  return true;
}

Assistant:

static bool compress_file(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options, const char *pSeed_filename, float *pTotal_comp_time = NULL)
{
	if (pTotal_comp_time)
		*pTotal_comp_time = 0;

   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   uint64 cmp_file_header_size = _ftelli64(pOutFile);

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_extreme_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   if (options.m_deterministic_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   if (options.m_tradeoff_decomp_rate_for_comp_ratio)
      params.m_compress_flags |= LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO;
   if (options.m_force_single_threaded_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING;
   if (options.m_low_memory_finder)
      params.m_compress_flags |= LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER;
   params.m_fast_bytes = options.m_fast_bytes;

   params.m_table_update_rate = options.m_table_update_rate;
   params.m_extreme_parsing_max_best_arrivals  = options.m_max_best_arrivals;

   if (pSeed_filename)
   {
      if (!read_seed_file(pSeed_filename, params.m_num_seed_bytes, params.m_pSeed_bytes, params.m_dict_size_log2))
      {
         _aligned_free(in_file_buf);
         _aligned_free(out_file_buf);
         fclose(pInFile);
         fclose(pOutFile);
         return false;
      }
   }

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

	float total_comp_time = (float)timer::ticks_to_secs(total_init_time);

   if ((pComp_state) && (options.m_test_compressor_reinit))
   {
      if (!lzham_dll.lzham_compress_reinit(pComp_state))
      {
         lzham_dll.lzham_compress_deinit(pComp_state);
         pComp_state = NULL;
      }
   }

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      _aligned_free((void*)params.m_pSeed_bytes);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status = LZHAM_COMP_STATUS_FAILED;

   // Performs 1 pass normally, or 2 passes to test compressor reinitialization (with a reinit in between the passes).
   uint total_passes = options.m_test_compressor_reinit ? 2 : 1;
   for (uint pass = 0; pass < total_passes; ++pass)
   {
      for ( ; ; )
      {
         if (src_file_size)
         {
            double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
            double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
            double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

   #ifdef LZHAM_PRINT_OUTPUT_PROGRESS
            for (int i = 0; i < 15; i++)
               printf("\b\b\b\b");
            printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
            printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
   #endif
         }

         if (in_file_buf_ofs == in_file_buf_size)
         {
            in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

            if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
            {
               printf("\n");
               print_error("Failure reading from source file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            src_bytes_left -= in_file_buf_size;

            in_file_buf_ofs = 0;
         }

         uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
         size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
         uint8* pOut_bytes = out_file_buf;
         size_t out_num_bytes = cOutBufSize;

			timer_ticks comp_start_time = timer::get_ticks();
         status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);
			timer_ticks comp_time = timer::get_ticks() - comp_start_time;

			total_comp_time += (float)timer::ticks_to_secs(comp_time);

         if (num_in_bytes)
         {
            in_file_buf_ofs += (uint)num_in_bytes;
            assert(in_file_buf_ofs <= in_file_buf_size);
         }

         if (out_num_bytes)
         {
            if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
            {
               printf("\n");
               print_error("Failure writing to destination file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            total_output_bytes += out_num_bytes;
         }

         if (status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
            break;
      }

#ifdef LZHAM_PRINT_OUTPUT_PROGRESS
      for (int i = 0; i < 15; i++)
      {
         printf("\b\b\b\b    \b\b\b\b");
      }
#endif

      if ((pass == 0) && (total_passes == 2))
      {
         printf("\n");

         uint64 cmp_file_size = _ftelli64(pOutFile);
         printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);

         init_start_time = timer::get_ticks();
         if (!lzham_dll.lzham_compress_reinit(pComp_state))
         {
            print_error("Failed reinitializing compressor!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            _aligned_free((void*)params.m_pSeed_bytes);
            lzham_dll.lzham_compress_deinit(pComp_state);
            return false;
         }
         total_init_time = timer::get_ticks() - init_start_time;
         printf("lzham_compress_reinit took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

         fseek(pInFile, 0, SEEK_SET);
         fseek(pOutFile, static_cast<long>(cmp_file_header_size), SEEK_SET);

         src_bytes_left = src_file_size;
         in_file_buf_size = 0;
         in_file_buf_ofs = 0;
         total_output_bytes = 0;
      }
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

	timer_ticks deinit_start_time = timer::get_ticks();
   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
	timer_ticks total_deinit_time = timer::get_ticks() - deinit_start_time;

	total_comp_time += (float)timer::ticks_to_secs(total_deinit_time);
	if (pTotal_comp_time)
		*pTotal_comp_time = total_comp_time;

   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;
   _aligned_free((void*)params.m_pSeed_bytes);
   params.m_pSeed_bytes = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
	printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_comp_time, src_file_size / total_comp_time, cmp_file_size / total_comp_time);
   printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}